

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_>::TPZCompElWithMem
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_> *this,TPZCompMesh *mesh,
          TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  TPZRegisterClassId *in_RDI;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_stack_000001e8
  ;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_stack_000001f0
  ;
  TPZCompElH1<pzshape::TPZShapePoint> *in_stack_000001f8;
  TPZCompMesh *in_stack_00000200;
  void **in_stack_00000208;
  TPZCompElH1<pzshape::TPZShapePoint> *in_stack_00000210;
  TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_> *in_stack_ffffffffffffffb8;
  TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_> *in_stack_ffffffffffffffc0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>>>
            (in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024ea308);
  TPZCompElH1<pzshape::TPZShapePoint>::TPZCompElH1
            (in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8,
             in_stack_000001f0,in_stack_000001e8);
  *(undefined ***)in_RDI = &PTR__TPZCompElWithMem_024e9ee0;
  *(undefined ***)in_RDI = &PTR__TPZCompElWithMem_024e9ee0;
  TPZStack<long,_128>::TPZStack((TPZStack<long,_128> *)in_RDI);
  CopyIntPtIndicesFrom(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem(TPZCompMesh &mesh,
                                          const TPZCompElWithMem<TBASE> &copy,
                                          std::map<int64_t,int64_t> & gl2lcConMap,
                                          std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE(mesh,copy,gl2lcConMap,gl2lcElMap)
{
    CopyIntPtIndicesFrom(copy);
}